

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void Curl_updateconninfo(Curl_easy *data,connectdata *conn,curl_socket_t sockfd)

{
  uint uVar1;
  int local_port;
  char local_ip [46];
  int local_5c;
  char local_58 [48];
  
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  local_58[0x24] = '\0';
  local_58[0x25] = '\0';
  local_58[0x26] = '\0';
  local_58[0x27] = '\0';
  local_58[0x28] = '\0';
  local_58[0x29] = '\0';
  local_58[0x2a] = '\0';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\0';
  local_58[0x2d] = '\0';
  local_5c = -1;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((-1 < (char)uVar1) && (((uVar1 >> 0x19 & 1) == 0 || (conn->transport != '\x03')))) {
    Curl_conninfo_remote(data,conn,sockfd);
  }
  Curl_conninfo_local(data,sockfd,local_58,&local_5c);
  Curl_persistconninfo(data,conn,local_58,local_5c);
  return;
}

Assistant:

void Curl_updateconninfo(struct Curl_easy *data, struct connectdata *conn,
                         curl_socket_t sockfd)
{
  /* 'local_ip' and 'local_port' get filled with local's numerical
     ip address and port number whenever an outgoing connection is
     **established** from the primary socket to a remote address. */
  char local_ip[MAX_IPADR_LEN] = "";
  int local_port = -1;

  if(!conn->bits.reuse &&
     (conn->transport != TRNSPRT_TCP || !conn->bits.tcp_fastopen))
    Curl_conninfo_remote(data, conn, sockfd);
  Curl_conninfo_local(data, sockfd, local_ip, &local_port);

  /* persist connection info in session handle */
  Curl_persistconninfo(data, conn, local_ip, local_port);
}